

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O2

void lws_cache_heap_item_destroy
               (lws_cache_ttl_lru_t_heap_t *cache,lws_cache_ttl_item_heap_t *item,int parent_too)

{
  lws_dll2 *plVar1;
  uint32_t uVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  lws_cache_ttl_lru_t_heap_t *plVar6;
  lws_cache_ttl_item_heap_t *plVar7;
  lws_dll2 *plVar8;
  lws_cache_ttl_item_heap_t *__s;
  
  if (*(char *)((long)&item[1].list_expiry.prev + item->size) != '!') {
    pcVar4 = (char *)((long)&item[1].list_expiry.prev + item->size);
    plVar6 = (lws_cache_ttl_lru_t_heap_t *)(cache->cache).info.parent;
    plVar1 = (cache->items_lru).head;
    if (plVar6 == (lws_cache_ttl_lru_t_heap_t *)0x0) {
      plVar6 = cache;
    }
    while (plVar8 = plVar1, plVar8 != (lws_dll2 *)0x0) {
      plVar1 = plVar8->next;
      if (*(char *)((long)&item[1].list_expiry.prev + item->size) == '!') {
        __s = (lws_cache_ttl_item_heap_t *)((long)&item[1].list_expiry.prev + item->size);
        sVar5 = strlen((char *)__s);
        for (plVar7 = item + 1; plVar7 < __s;
            plVar7 = (lws_cache_ttl_item_heap_t *)
                     ((long)&(plVar7->list_expiry).prev + (ulong)(uVar2 + 9))) {
          uVar2 = lws_ser_ru32be((uint8_t *)((long)&(plVar7->list_expiry).prev + 4));
          if ((sVar5 == uVar2) &&
             (iVar3 = strcmp((char *)&(plVar7->list_expiry).next,(char *)__s), iVar3 == 0)) {
            iVar3 = (*((plVar6->cache).info.ops)->tag_match)
                              (&plVar6->cache,(char *)((long)&(__s->list_expiry).prev + 1),pcVar4,
                               '\x01');
            if (iVar3 != 0) {
              __assert_fail("!backing->info.ops->tag_match( backing, iname + 1, tag, 1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/misc/cache-ttl/heap.c"
                            ,0x7f,
                            "void lws_cache_heap_item_destroy(lws_cache_ttl_lru_t_heap_t *, lws_cache_ttl_item_heap_t *, int)"
                           );
            }
            _lws_cache_heap_item_destroy(cache,(lws_cache_ttl_item_heap_t *)(plVar8 + -1));
            break;
          }
        }
        iVar3 = (*((plVar6->cache).info.ops)->tag_match)
                          (&plVar6->cache,(char *)((long)&(__s->list_expiry).prev + 1),pcVar4,'\x01'
                          );
        if (iVar3 == 0) {
          __assert_fail("backing->info.ops->tag_match(backing, iname + 1, tag, 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/misc/cache-ttl/heap.c"
                        ,0x8e,
                        "void lws_cache_heap_item_destroy(lws_cache_ttl_lru_t_heap_t *, lws_cache_ttl_item_heap_t *, int)"
                       );
        }
      }
    }
  }
  _lws_cache_heap_item_destroy(cache,item);
  return;
}

Assistant:

static void
lws_cache_heap_item_destroy(lws_cache_ttl_lru_t_heap_t *cache,
			    lws_cache_ttl_item_heap_t *item, int parent_too)
{
	struct lws_cache_ttl_lru *backing = &cache->cache;
	const char *tag = ((const char *)&item[1]) + item->size;

	/*
	 * We're destroying a normal item?
	 */

	if (*tag == META_ITEM_LEADING)
		/* no, nothing to check here then */
		goto post;

	if (backing->info.parent)
		backing = backing->info.parent;

	/*
	 * We need to check any cached meta-results from lookups that
	 * include this normal item, and if any, invalidate the meta-results
	 * since they have to be recalculated before being used again.
	 */

	lws_start_foreach_dll_safe(struct lws_dll2 *, d, d1,
				   cache->items_lru.head) {
		lws_cache_ttl_item_heap_t *i = lws_container_of(d,
						lws_cache_ttl_item_heap_t,
						list_lru);
		const char *iname = ((const char *)&item[1]) + item->size;
		uint8_t *pay = (uint8_t *)&item[1], *end = pay + item->size;

		if (*iname == META_ITEM_LEADING) {
			size_t taglen = strlen(iname);

			/*
			 * If the item about to be destroyed makes an
			 * appearance on the meta results list, we must kill
			 * the meta result item to force recalc next time
			 */

			while (pay < end) {
				uint32_t tlen = lws_ser_ru32be(pay + 4);

				if (tlen == taglen &&
				    !strcmp((const char *)pay + 8, iname)) {
#if defined(_DEBUG)
					/*
					 * Sanity check that the item tag is
					 * really a match for that meta results
					 * item
					 */

					assert (!backing->info.ops->tag_match(
						 backing, iname + 1, tag, 1));
#endif
					_lws_cache_heap_item_destroy(cache, i);
					break;
				}
				pay += 8 + tlen + 1;
			}

#if defined(_DEBUG)
			/*
			 * Sanity check that the item tag really isn't a match
			 * for that meta results item
			 */

			assert (backing->info.ops->tag_match(backing, iname + 1,
							  tag, 1));
#endif
		}

	} lws_end_foreach_dll_safe(d, d1);

post:
	_lws_cache_heap_item_destroy(cache, item);
}